

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O3

Map_Time_t * Abc_NtkMapCopyCoRequired(Abc_Ntk_t *pNtk,Abc_Time_t *ppTimes)

{
  Abc_Time_t AVar1;
  Map_Time_t *pMVar2;
  float *pfVar3;
  size_t sVar4;
  size_t __nmemb;
  float fVar5;
  
  __nmemb = (size_t)pNtk->vCos->nSize;
  pMVar2 = (Map_Time_t *)calloc(__nmemb,0xc);
  if ((long)__nmemb < 1) {
    if (ppTimes == (Abc_Time_t *)0x0) {
      return pMVar2;
    }
  }
  else {
    pfVar3 = &pMVar2->Worst;
    sVar4 = 0;
    do {
      AVar1 = ppTimes[sVar4];
      ((Map_Time_t *)(pfVar3 + -2))->Rise = AVar1.Rise;
      ((Map_Time_t *)(pfVar3 + -2))->Fall = AVar1.Fall;
      fVar5 = AVar1.Fall;
      if (AVar1.Fall <= AVar1.Rise) {
        fVar5 = AVar1.Rise;
      }
      *pfVar3 = fVar5;
      sVar4 = sVar4 + 1;
      pfVar3 = pfVar3 + 3;
    } while (__nmemb != sVar4);
  }
  free(ppTimes);
  return pMVar2;
}

Assistant:

Map_Time_t * Abc_NtkMapCopyCoRequired( Abc_Ntk_t * pNtk, Abc_Time_t * ppTimes )
{
    Map_Time_t * p;
    int i;
    p = ABC_CALLOC( Map_Time_t, Abc_NtkCoNum(pNtk) );
    for ( i = 0; i < Abc_NtkCoNum(pNtk); i++ )
    {
        p[i].Fall = ppTimes[i].Fall;
        p[i].Rise = ppTimes[i].Rise;
        p[i].Worst = Abc_MaxFloat( p[i].Fall, p[i].Rise );
    }
    ABC_FREE( ppTimes );
    return p;
}